

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_dissipated_exp_entropy.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FILE *__s;
  double *pdVar9;
  undefined4 uVar10;
  code *pcVar11;
  char *pcVar12;
  code *pcVar13;
  ulong uVar14;
  double dVar15;
  sunrealtype t;
  SUNContext ctx;
  long nst;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nrnlsf;
  long nrnlsi;
  long nrje;
  long nre;
  long nrbf;
  long nrf;
  long nfi;
  long nfe;
  long nst_a;
  double local_118;
  double local_110;
  undefined8 local_108;
  long local_100;
  long local_f8;
  double local_f0;
  long local_e8;
  undefined4 local_dc;
  double local_d8;
  double local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  double *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  uVar14 = 0;
  local_108 = 0;
  local_100 = 0;
  if (argc < 2) {
LAB_0010256c:
    puts("\nDissipated Exponential Entropy problem:");
    local_118 = 0.0;
    pcVar12 = "   method     = DIRK";
    uVar10 = 0;
  }
  else {
    iVar2 = atoi(argv[1]);
    uVar14 = (ulong)(iVar2 == 0);
    if (argc == 2) goto LAB_0010256c;
    iVar2 = atoi(argv[2]);
    if ((uint)argc < 4) {
      puts("\nDissipated Exponential Entropy problem:");
      local_118 = 0.0;
    }
    else {
      local_118 = atof(argv[3]);
      puts("\nDissipated Exponential Entropy problem:");
    }
    if (iVar2 == 0) {
      uVar10 = (undefined4)CONCAT71((uint7)(uint3)((uint)argc >> 8),1);
      pcVar12 = "   method     = ERK";
    }
    else {
      uVar10 = 0;
      pcVar12 = "   method     = DIRK";
    }
  }
  puts(pcVar12);
  printf("   reltol     = %.1e\n",0xa0b5ed8d);
  printf("   abstol     = %.1e\n",0xd9d7bdbb);
  if (0.0 < local_118) {
    printf("   fixed h    = %.1e\n",SUB84(local_118,0));
  }
  pcVar12 = "   relaxation = ON";
  if ((char)uVar14 != '\0') {
    pcVar12 = "   relaxation = OFF";
  }
  puts(pcVar12);
  putchar(10);
  uVar3 = SUNContext_Create(0,&local_108);
  if ((int)uVar3 < 0) {
    pcVar12 = "SUNContext_Create";
  }
  else {
    lVar4 = N_VNew_Serial(2,local_108);
    if (lVar4 == 0) {
      main_cold_7();
      return 1;
    }
    pdVar5 = (double *)N_VGetArrayPointer(lVar4);
    if (pdVar5 == (double *)0x0) {
      main_cold_6();
      return 1;
    }
    *(undefined4 *)pdVar5 = 0;
    *(undefined4 *)((long)pdVar5 + 4) = 0x3ff00000;
    *(undefined4 *)(pdVar5 + 1) = 0;
    *(undefined4 *)((long)pdVar5 + 0xc) = 0x3fe00000;
    lVar6 = N_VClone(lVar4);
    if (lVar6 == 0) {
      main_cold_5();
      return 1;
    }
    local_b0 = (double *)N_VGetArrayPointer(lVar6);
    if (local_b0 == (double *)0x0) {
      main_cold_4();
      return 1;
    }
    if ((char)uVar10 == '\0') {
      pcVar11 = f;
      pcVar13 = (code *)0x0;
    }
    else {
      pcVar13 = f;
      pcVar11 = (code *)0x0;
    }
    local_f8 = lVar4;
    lVar4 = ARKStepCreate(0,pcVar13,pcVar11,lVar4,local_108);
    local_100 = lVar4;
    if (lVar4 == 0) {
      main_cold_3();
      return 1;
    }
    uVar3 = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,lVar4);
    if ((int)uVar3 < 0) {
      pcVar12 = "ARKodeSStolerances";
    }
    else if (((char)uVar14 == '\0') && (uVar3 = ARKodeSetRelaxFn(lVar4,Ent,JacEnt), (int)uVar3 < 0))
    {
      pcVar12 = "ARKodeSetRelaxFn";
    }
    else {
      local_dc = uVar10;
      if ((char)uVar10 == '\0') {
        lVar7 = SUNDenseMatrix(2,2,local_108);
        if (lVar7 == 0) {
          main_cold_2();
          return 1;
        }
        lVar8 = SUNLinSol_Dense(local_f8,lVar7,local_108);
        if (lVar8 == 0) {
          main_cold_1();
          return 1;
        }
        uVar3 = ARKodeSetLinearSolver(lVar4,lVar8,lVar7);
        if ((int)uVar3 < 0) {
          pcVar12 = "ARKodeSetLinearSolver";
          goto LAB_00103147;
        }
        uVar3 = ARKodeSetJacFn(lVar4,Jac);
        if ((int)uVar3 < 0) {
          pcVar12 = "ARKodeSetJacFn";
          goto LAB_00103147;
        }
        uVar3 = ARKStepSetTableName(lVar4,"ARKODE_ARK2_DIRK_3_1_2","ARKODE_ERK_NONE");
        if ((int)uVar3 < 0) {
          pcVar12 = "ARKStepSetTableName";
          goto LAB_00103147;
        }
        uVar3 = ARKodeSetNonlinConvCoef(0x47ae147b,lVar4);
        if ((int)uVar3 < 0) {
          pcVar12 = "ARKodeSetNonlinConvCoef";
          goto LAB_00103147;
        }
      }
      else {
        lVar8 = 0;
        lVar7 = 0;
      }
      if ((local_118 <= 0.0) ||
         (uVar3 = ARKodeSetFixedStep(SUB84(local_118,0),lVar4), -1 < (int)uVar3)) {
        local_c8 = lVar8;
        local_c0 = lVar7;
        local_b8 = uVar14;
        __s = fopen("ark_dissipated_exp_entropy.txt","w");
        fwrite("# vars: t u entropy u_err delta_entropy\n",0x28,1,__s);
        local_110 = 0.0;
        pdVar9 = (double *)N_VGetArrayPointer(local_f8);
        local_d0 = exp(*pdVar9);
        fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e\n",0,*pdVar5,local_d0,0,0);
        puts(" step   t              u              e              u_err          delta e");
        puts(" -------------------------------------------------------------------------------");
        printf("%5d %14.6e %14.6e %14.6e %14.6e %14.6e\n",SUB84(local_110,0),*pdVar5,local_d0,0,0,0)
        ;
        lVar7 = local_f8;
        do {
          local_f8 = lVar7;
          if (5.0 <= local_110) {
LAB_00102b8c:
            puts(" -------------------------------------------------------------------------------")
            ;
            fclose(__s);
            uVar3 = ARKodeGetNumSteps(lVar4,&local_e8);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumSteps",(ulong)uVar3);
            }
            lVar4 = local_100;
            uVar3 = ARKodeGetNumStepAttempts(local_100,&local_38);
            uVar14 = local_b8;
            lVar7 = local_f8;
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumStepAttempts",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumErrTestFails(lVar4,&local_a8);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumErrTestFails",(ulong)uVar3);
            }
            uVar3 = ARKStepGetNumRhsEvals(lVar4,&local_40,&local_48);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"ERROR: %s() returned %d\n","ARKStepGetNumRhsEvals",(ulong)uVar3);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li (attempted = %li)\n",local_e8,local_38);
            printf("   Total number of error test failures = %li\n",local_a8);
            printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_40,local_48);
            if ((char)local_dc == '\0') {
              uVar3 = ARKodeGetNumNonlinSolvIters(lVar4,&local_98);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumNonlinSolvIters",
                        (ulong)uVar3);
              }
              uVar3 = ARKodeGetNumNonlinSolvConvFails(lVar4,&local_a0);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumNonlinSolvConvFails",
                        (ulong)uVar3);
              }
              uVar3 = ARKodeGetNumLinSolvSetups(lVar4,&local_80);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumLinSolvSetups",(ulong)uVar3
                       );
              }
              uVar3 = ARKodeGetNumJacEvals(lVar4,&local_88);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumJacEvals",(ulong)uVar3);
              }
              uVar3 = ARKodeGetNumLinRhsEvals(lVar4,&local_90);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumLinRhsEvals",(ulong)uVar3);
              }
              printf("   Total number of Newton iterations = %li\n",local_98);
              printf("   Total number of linear solver convergence failures = %li\n",local_a0);
              printf("   Total linear solver setups = %li\n",local_80);
              printf("   Total number of Jacobian evaluations = %li\n",local_88);
              printf("   Total RHS evals for setting up the linear system = %li\n",local_90);
            }
            if ((char)uVar14 == '\0') {
              uVar3 = ARKodeGetNumRelaxFnEvals(lVar4,&local_60);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxFnEvals",(ulong)uVar3)
                ;
              }
              uVar3 = ARKodeGetNumRelaxJacEvals(lVar4,&local_68);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxJacEvals",(ulong)uVar3
                       );
              }
              uVar3 = ARKodeGetNumRelaxFails(lVar4,&local_50);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxFails",(ulong)uVar3);
              }
              uVar3 = ARKodeGetNumRelaxBoundFails(lVar4,&local_58);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxBoundFails",
                        (ulong)uVar3);
              }
              uVar3 = ARKodeGetNumRelaxSolveFails(lVar4,&local_78);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxSolveFails",
                        (ulong)uVar3);
              }
              uVar3 = ARKodeGetNumRelaxSolveIters(lVar4,&local_70);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumRelaxSolveIters",
                        (ulong)uVar3);
              }
              printf("   Total Relaxation Fn evals    = %li\n",local_60);
              printf("   Total Relaxation Jac evals   = %li\n",local_68);
              printf("   Total Relaxation fails       = %li\n",local_50);
              printf("   Total Relaxation bound fails = %li\n",local_58);
              printf("   Total Relaxation NLS fails   = %li\n",local_78);
              printf("   Total Relaxation NLS iters   = %li\n",local_70);
            }
            putchar(10);
            ARKodeFree(&local_100);
            SUNLinSolFree(local_c8);
            SUNMatDestroy(local_c0);
            N_VDestroy(lVar7);
            N_VDestroy(lVar6);
            SUNContext_Free(&local_108);
            return uVar3;
          }
          uVar3 = ARKodeEvolve(lVar4,lVar7,&local_110,2);
          if ((int)uVar3 < 0) {
            fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeEvolve",(ulong)uVar3);
            lVar4 = local_100;
            goto LAB_00102b8c;
          }
          pdVar9 = (double *)N_VGetArrayPointer(lVar7);
          dVar1 = exp(*pdVar9);
          local_f0 = local_110;
          pdVar9 = (double *)N_VGetArrayPointer(lVar6);
          dVar15 = log(local_f0 + 0.6065306597126334);
          lVar4 = local_100;
          *pdVar9 = dVar15;
          local_f0 = *pdVar5 - *local_b0;
          uVar3 = ARKodeGetNumSteps(local_100,&local_e8);
          if ((int)uVar3 < 0) {
            fprintf(_stderr,"ERROR: %s() returned %d\n","ARKodeGetNumSteps",(ulong)uVar3);
          }
          dVar15 = dVar1 - local_d0;
          if ((local_e8 * -0x3333333333333333 + 0x1999999999999998U >> 3 |
              local_e8 * -0x3333333333333333 << 0x3d) < 0x666666666666667) {
            local_d8 = dVar15;
            printf("%5ld %14.6e %14.6e %14.6e %14.6e %14.6e\n",SUB84(local_110,0),*pdVar5,dVar1,
                   local_f0,dVar15);
            dVar15 = local_d8;
          }
          fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e\n",SUB84(local_110,0),*pdVar5,dVar1,
                  local_f0,dVar15);
          lVar7 = local_f8;
        } while( true );
      }
      pcVar12 = "ARKodeSetFixedStep";
    }
  }
LAB_00103147:
  fprintf(_stderr,"ERROR: %s() returned %d\n",pcVar12,(ulong)uVar3);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Error-checking flag */
  int flag;

  /* Initial and final times */
  sunrealtype t0 = SUN_RCONST(0.0);
  sunrealtype tf = SUN_RCONST(5.0);

  /* Relative and absolute tolerances */
  sunrealtype reltol = SUN_RCONST(1.0e-6);
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* SUNDIALS context, vector, matrix, and linear solver objects */
  SUNContext ctx     = NULL;
  N_Vector y         = NULL;
  N_Vector ytrue     = NULL;
  SUNMatrix A        = NULL;
  SUNLinearSolver LS = NULL;

  /* Pointer to vector data array */
  sunrealtype* ydata;
  sunrealtype* ytdata;

  /* Initial, current, and change in entropy value */
  sunrealtype ent0, ent, delta_ent;

  /* Solution errors */
  sunrealtype u_err;

  /* ARKODE memory structure */
  void* arkode_mem = NULL;

  /* ARKODE statistics */
  long int nst, nst_a, nfe, nfi;
  long int nrf, nrbf, nre, nrje, nrnlsi, nrnlsf;
  long int nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Output time and file */
  sunrealtype t;
  FILE* UFID;

  /* Command line options */
  int relax           = 1;               /* enable relaxation */
  int implicit        = 1;               /* implicit          */
  sunrealtype fixed_h = SUN_RCONST(0.0); /* adaptive stepping */

  /* -------------------- *
   * Output Problem Setup *
   * -------------------- */

  if (argc > 1) { relax = atoi(argv[1]); }
  if (argc > 2) { implicit = atoi(argv[2]); }
  if (argc > 3) { fixed_h = atof(argv[3]); }

  printf("\nDissipated Exponential Entropy problem:\n");
  if (implicit) { printf("   method     = DIRK\n"); }
  else { printf("   method     = ERK\n"); }
  printf("   reltol     = %.1" ESYM "\n", reltol);
  printf("   abstol     = %.1" ESYM "\n", abstol);
  if (fixed_h > SUN_RCONST(0.0))
  {
    printf("   fixed h    = %.1" ESYM "\n", fixed_h);
  }
  if (relax) { printf("   relaxation = ON\n"); }
  else { printf("   relaxation = OFF\n"); }
  printf("\n");

  /* ------------ *
   * Setup ARKODE *
   * ------------ */

  /* Create the SUNDIALS context object for this simulation */
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(flag, "SUNContext_Create")) { return 1; }

  /* Create serial vector and set the initial condition values */
  y = N_VNew_Serial(2, ctx);
  if (check_ptr(y, "N_VNew_Serial")) { return 1; }

  ydata = N_VGetArrayPointer(y);
  if (check_ptr(ydata, "N_VGetArrayPointer")) { return 1; }

  ydata[0] = SUN_RCONST(1.0);
  ydata[1] = SUN_RCONST(0.5);

  ytrue = N_VClone(y);
  if (check_ptr(ytrue, "N_VClone")) { return 1; }

  ytdata = N_VGetArrayPointer(ytrue);
  if (check_ptr(ytdata, "N_VGetArrayPointer")) { return 1; }

  /* Initialize ARKStep */
  if (implicit) { arkode_mem = ARKStepCreate(NULL, f, t0, y, ctx); }
  else { arkode_mem = ARKStepCreate(f, NULL, t0, y, ctx); }
  if (check_ptr(arkode_mem, "ARKStepCreate")) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(flag, "ARKodeSStolerances")) { return 1; }

  if (relax)
  {
    /* Enable relaxation methods */
    flag = ARKodeSetRelaxFn(arkode_mem, Ent, JacEnt);
    if (check_flag(flag, "ARKodeSetRelaxFn")) { return 1; }
  }

  if (implicit)
  {
    /* Create dense matrix and linear solver */
    A = SUNDenseMatrix(2, 2, ctx);
    if (check_ptr(A, "SUNDenseMatrix")) { return 1; }

    LS = SUNLinSol_Dense(y, A, ctx);
    if (check_ptr(LS, "SUNLinSol_Dense")) { return 1; }

    /* Attach the matrix and linear solver */
    flag = ARKodeSetLinearSolver(arkode_mem, LS, A);
    if (check_flag(flag, "ARKodeSetLinearSolver")) { return 1; }

    /* Set Jacobian routine */
    flag = ARKodeSetJacFn(arkode_mem, Jac);
    if (check_flag(flag, "ARKodeSetJacFn")) { return 1; }

    /* Select a Butcher table with non-negative b values */
    flag = ARKStepSetTableName(arkode_mem, "ARKODE_ARK2_DIRK_3_1_2",
                               "ARKODE_ERK_NONE");
    if (check_flag(flag, "ARKStepSetTableName")) { return 1; }

    /* Tighten nonlinear solver tolerance */
    flag = ARKodeSetNonlinConvCoef(arkode_mem, SUN_RCONST(0.01));
    if (check_flag(flag, "ARKodeSetNonlinConvCoef")) { return 1; }
  }

  if (fixed_h > SUN_RCONST(0.0))
  {
    flag = ARKodeSetFixedStep(arkode_mem, fixed_h);
    if (check_flag(flag, "ARKodeSetFixedStep")) { return 1; }
  }

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_dissipated_exp_entropy.txt", "w");
  fprintf(UFID, "# vars: t u entropy u_err delta_entropy\n");

  /* --------------- *
   * Advance in Time *
   * --------------- */

  /* Initial time */
  t = t0;

  /* Output the initial condition and entropy */
  flag = Ent(y, &ent0, NULL);
  if (check_flag(flag, "Ent")) { return 1; }

  fprintf(UFID,
          "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
          " %23.16" ESYM "\n",
          t0, ydata[0], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0));

  printf(" step   t              u              e              u_err          "
         "delta e\n");
  printf(" --------------------------------------------------------------------"
         "-----------\n");
  printf("%5d %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
         " %14.6" ESYM "\n",
         0, t, ydata[0], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0));

  while (t < tf)
  {
    /* Evolve in time */
    flag = ARKodeEvolve(arkode_mem, tf, y, &t, ARK_ONE_STEP);
    if (check_flag(flag, "ARKodeEvolve")) { break; }

    /* Output solution and errors */
    flag = Ent(y, &ent, NULL);
    if (check_flag(flag, "Ent")) { return 1; }

    flag = ans(t, ytrue);
    if (check_flag(flag, "ans")) { return 1; }

    delta_ent = ent - ent0;
    u_err     = ydata[0] - ytdata[0];

    /* Output to the screen periodically */
    flag = ARKodeGetNumSteps(arkode_mem, &nst);
    check_flag(flag, "ARKodeGetNumSteps");

    if (nst % 40 == 0)
    {
      printf("%5ld %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
             " %14.6" ESYM "\n",
             nst, t, ydata[0], ent, u_err, delta_ent);
    }

    /* Write all steps to file */
    fprintf(UFID,
            "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
            " %23.16" ESYM "\n",
            t, ydata[0], ent, u_err, delta_ent);
  }

  printf(" --------------------------------------------------------------------"
         "-----------\n");
  fclose(UFID);

  /* ------------ *
   * Output Stats *
   * ------------ */

  /* Get final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(flag, "ARKodeGetNumSteps");

  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(flag, "ARKodeGetNumStepAttempts");

  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(flag, "ARKodeGetNumErrTestFails");

  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(flag, "ARKStepGetNumRhsEvals");

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);

  if (implicit)
  {
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    check_flag(flag, "ARKodeGetNumNonlinSolvIters");

    flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
    check_flag(flag, "ARKodeGetNumNonlinSolvConvFails");

    flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
    check_flag(flag, "ARKodeGetNumLinSolvSetups");

    flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
    check_flag(flag, "ARKodeGetNumJacEvals");

    flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
    check_flag(flag, "ARKodeGetNumLinRhsEvals");

    printf("   Total number of Newton iterations = %li\n", nni);
    printf("   Total number of linear solver convergence failures = %li\n", ncfn);
    printf("   Total linear solver setups = %li\n", nsetups);
    printf("   Total number of Jacobian evaluations = %li\n", nje);
    printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  }

  if (relax)
  {
    flag = ARKodeGetNumRelaxFnEvals(arkode_mem, &nre);
    check_flag(flag, "ARKodeGetNumRelaxFnEvals");

    flag = ARKodeGetNumRelaxJacEvals(arkode_mem, &nrje);
    check_flag(flag, "ARKodeGetNumRelaxJacEvals");

    flag = ARKodeGetNumRelaxFails(arkode_mem, &nrf);
    check_flag(flag, "ARKodeGetNumRelaxFails");

    flag = ARKodeGetNumRelaxBoundFails(arkode_mem, &nrbf);
    check_flag(flag, "ARKodeGetNumRelaxBoundFails");

    flag = ARKodeGetNumRelaxSolveFails(arkode_mem, &nrnlsf);
    check_flag(flag, "ARKodeGetNumRelaxSolveFails");

    flag = ARKodeGetNumRelaxSolveIters(arkode_mem, &nrnlsi);
    check_flag(flag, "ARKodeGetNumRelaxSolveIters");

    printf("   Total Relaxation Fn evals    = %li\n", nre);
    printf("   Total Relaxation Jac evals   = %li\n", nrje);
    printf("   Total Relaxation fails       = %li\n", nrf);
    printf("   Total Relaxation bound fails = %li\n", nrbf);
    printf("   Total Relaxation NLS fails   = %li\n", nrnlsf);
    printf("   Total Relaxation NLS iters   = %li\n", nrnlsi);
  }
  printf("\n");

  /* -------- *
   * Clean up *
   * -------- */

  /* Free ARKODE integrator and SUNDIALS objects */
  ARKodeFree(&arkode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(y);
  N_VDestroy(ytrue);
  SUNContext_Free(&ctx);

  return flag;
}